

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::ObjectIntersector1<false>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  uint uVar3;
  Geometry *this;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  ulong uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  byte bVar15;
  bool bVar16;
  bool bVar17;
  long lVar18;
  byte bVar19;
  byte bVar20;
  ulong *puVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [32];
  undefined1 auVar46 [64];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2448 [16];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2378 == 8) {
    bVar16 = false;
  }
  else {
    local_2370[0] = 0;
    auVar25 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[0]));
    auVar44 = ZEXT3264(auVar25);
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_2448 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar2 = (context->query_radius).field_0;
      local_2448 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    }
    puVar21 = local_2368;
    auVar26 = vbroadcastss_avx512vl(ZEXT416((uint)(query->p).field_0.field_0.x));
    auVar27 = vbroadcastss_avx512vl(ZEXT416((uint)(query->p).field_0.field_0.y));
    auVar28 = vbroadcastss_avx512vl(ZEXT416((uint)(query->p).field_0.field_0.z));
    auVar29 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[1]));
    auVar46 = ZEXT3264(auVar29);
    auVar29 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[2]));
    auVar48 = ZEXT3264(auVar29);
    auVar24 = vmulss_avx512f(auVar25._0_16_,auVar25._0_16_);
    auVar25._0_4_ = auVar24._0_4_;
    auVar25._4_4_ = auVar25._0_4_;
    auVar25._8_4_ = auVar25._0_4_;
    auVar25._12_4_ = auVar25._0_4_;
    auVar25._16_4_ = auVar25._0_4_;
    auVar25._20_4_ = auVar25._0_4_;
    auVar25._24_4_ = auVar25._0_4_;
    auVar25._28_4_ = auVar25._0_4_;
    bVar16 = false;
    auVar29 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar49 = ZEXT3264(auVar29);
    auVar29 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar50 = ZEXT3264(auVar29);
    do {
      auVar43 = auVar44._0_32_;
      auVar29 = vsubps_avx512vl(auVar26,auVar43);
      auVar30 = vaddps_avx512vl(auVar26,auVar43);
      auVar45 = auVar46._0_32_;
      auVar31 = vsubps_avx512vl(auVar27,auVar45);
      auVar32 = vaddps_avx512vl(auVar27,auVar45);
      auVar47 = auVar48._0_32_;
      auVar33 = vsubps_avx512vl(auVar28,auVar47);
      auVar34 = vaddps_avx512vl(auVar28,auVar47);
LAB_01f30b15:
      pfVar1 = (float *)(puVar21 + -1);
      puVar21 = puVar21 + -2;
      if (*pfVar1 <= (float)local_2448._0_4_) {
        uVar22 = *puVar21;
        do {
          do {
            if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
              if ((uVar22 & 8) != 0) {
LAB_01f30f8d:
                uVar23 = (ulong)((uint)uVar22 & 0xf);
                if (uVar23 != 8) {
                  lVar18 = 0;
                  bVar20 = 0;
                  do {
                    bVar19 = bVar20;
                    uVar3 = *(uint *)((uVar22 & 0xfffffffffffffff0) + lVar18 * 8);
                    this = (context->scene->geometries).items[uVar3].ptr;
                    context->geomID = uVar3;
                    context->primID = *(uint *)((uVar22 & 0xfffffffffffffff0) + 4 + lVar18 * 8);
                    bVar17 = Geometry::pointQuery(this,query,context);
                    lVar18 = lVar18 + 1;
                    bVar20 = bVar19 | bVar17;
                  } while (uVar23 - 8 != lVar18);
                  if (bVar19 == 0 && !bVar17) {
                    auVar44 = ZEXT3264(auVar43);
                    auVar46 = ZEXT3264(auVar45);
                    auVar48 = ZEXT3264(auVar47);
                    auVar25 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                    auVar49 = ZEXT3264(auVar25);
                    auVar25 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                    auVar50 = ZEXT3264(auVar25);
                  }
                  else {
                    auVar25 = vbroadcastss_avx512vl
                                        (ZEXT416((uint)(context->query_radius).field_0.m128[0]));
                    auVar44 = ZEXT3264(auVar25);
                    auVar25 = vbroadcastss_avx512vl
                                        (ZEXT416((uint)(context->query_radius).field_0.m128[1]));
                    auVar46 = ZEXT3264(auVar25);
                    auVar25 = vbroadcastss_avx512vl
                                        (ZEXT416((uint)(context->query_radius).field_0.m128[2]));
                    auVar48 = ZEXT3264(auVar25);
                    auVar25 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                    auVar49 = ZEXT3264(auVar25);
                    auVar25 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                    auVar50 = ZEXT3264(auVar25);
                    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
                      local_2448 = ZEXT416((uint)(query->radius * query->radius));
                    }
                    else {
                      aVar2 = (context->query_radius).field_0;
                      local_2448 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
                    }
                    bVar16 = true;
                  }
                }
                goto LAB_01f310cb;
              }
              auVar35 = vmaxps_avx512vl(auVar26,*(undefined1 (*) [32])(uVar22 + 0x40));
              auVar35 = vminps_avx(auVar35,*(undefined1 (*) [32])(uVar22 + 0x60));
              auVar36 = vsubps_avx512vl(auVar35,auVar26);
              auVar35 = vmaxps_avx512vl(auVar27,*(undefined1 (*) [32])(uVar22 + 0x80));
              auVar35 = vminps_avx(auVar35,*(undefined1 (*) [32])(uVar22 + 0xa0));
              auVar37 = vsubps_avx512vl(auVar35,auVar27);
              auVar35 = vmaxps_avx512vl(auVar28,*(undefined1 (*) [32])(uVar22 + 0xc0));
              auVar35 = vminps_avx(auVar35,*(undefined1 (*) [32])(uVar22 + 0xe0));
              auVar35 = vsubps_avx512vl(auVar35,auVar28);
              auVar41._0_4_ =
                   auVar35._0_4_ * auVar35._0_4_ +
                   auVar37._0_4_ * auVar37._0_4_ + auVar36._0_4_ * auVar36._0_4_;
              auVar41._4_4_ =
                   auVar35._4_4_ * auVar35._4_4_ +
                   auVar37._4_4_ * auVar37._4_4_ + auVar36._4_4_ * auVar36._4_4_;
              auVar41._8_4_ =
                   auVar35._8_4_ * auVar35._8_4_ +
                   auVar37._8_4_ * auVar37._8_4_ + auVar36._8_4_ * auVar36._8_4_;
              auVar41._12_4_ =
                   auVar35._12_4_ * auVar35._12_4_ +
                   auVar37._12_4_ * auVar37._12_4_ + auVar36._12_4_ * auVar36._12_4_;
              auVar41._16_4_ =
                   auVar35._16_4_ * auVar35._16_4_ +
                   auVar37._16_4_ * auVar37._16_4_ + auVar36._16_4_ * auVar36._16_4_;
              auVar41._20_4_ =
                   auVar35._20_4_ * auVar35._20_4_ +
                   auVar37._20_4_ * auVar37._20_4_ + auVar36._20_4_ * auVar36._20_4_;
              auVar41._24_4_ =
                   auVar35._24_4_ * auVar35._24_4_ +
                   auVar37._24_4_ * auVar37._24_4_ + auVar36._24_4_ * auVar36._24_4_;
              auVar41._28_4_ = auVar37._28_4_ + auVar37._28_4_ + auVar36._28_4_;
              uVar23 = vcmpps_avx512vl(auVar41,auVar25,2);
              uVar7 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar22 + 0x40),
                                      *(undefined1 (*) [32])(uVar22 + 0x60),2);
              uVar23 = uVar23 & uVar7;
            }
            else {
              if ((uVar22 & 8) != 0) goto LAB_01f30f8d;
              auVar35 = *(undefined1 (*) [32])(uVar22 + 0x40);
              auVar36 = *(undefined1 (*) [32])(uVar22 + 0x60);
              auVar37 = vmaxps_avx512vl(auVar26,auVar35);
              auVar37 = vminps_avx(auVar37,auVar36);
              auVar39 = vsubps_avx512vl(auVar37,auVar26);
              auVar37 = vmaxps_avx512vl(auVar27,*(undefined1 (*) [32])(uVar22 + 0x80));
              auVar37 = vminps_avx(auVar37,*(undefined1 (*) [32])(uVar22 + 0xa0));
              auVar38 = vsubps_avx512vl(auVar37,auVar27);
              auVar37 = vmaxps_avx512vl(auVar28,*(undefined1 (*) [32])(uVar22 + 0xc0));
              auVar37 = vminps_avx(auVar37,*(undefined1 (*) [32])(uVar22 + 0xe0));
              auVar37 = vsubps_avx512vl(auVar37,auVar28);
              auVar41._0_4_ =
                   auVar37._0_4_ * auVar37._0_4_ +
                   auVar38._0_4_ * auVar38._0_4_ + auVar39._0_4_ * auVar39._0_4_;
              auVar41._4_4_ =
                   auVar37._4_4_ * auVar37._4_4_ +
                   auVar38._4_4_ * auVar38._4_4_ + auVar39._4_4_ * auVar39._4_4_;
              auVar41._8_4_ =
                   auVar37._8_4_ * auVar37._8_4_ +
                   auVar38._8_4_ * auVar38._8_4_ + auVar39._8_4_ * auVar39._8_4_;
              auVar41._12_4_ =
                   auVar37._12_4_ * auVar37._12_4_ +
                   auVar38._12_4_ * auVar38._12_4_ + auVar39._12_4_ * auVar39._12_4_;
              auVar41._16_4_ =
                   auVar37._16_4_ * auVar37._16_4_ +
                   auVar38._16_4_ * auVar38._16_4_ + auVar39._16_4_ * auVar39._16_4_;
              auVar41._20_4_ =
                   auVar37._20_4_ * auVar37._20_4_ +
                   auVar38._20_4_ * auVar38._20_4_ + auVar39._20_4_ * auVar39._20_4_;
              auVar41._24_4_ =
                   auVar37._24_4_ * auVar37._24_4_ +
                   auVar38._24_4_ * auVar38._24_4_ + auVar39._24_4_ * auVar39._24_4_;
              auVar41._28_4_ = auVar38._28_4_ + auVar38._28_4_ + auVar39._28_4_;
              uVar14 = vcmpps_avx512vl(auVar35,auVar36,2);
              uVar8 = vcmpps_avx512vl(auVar36,auVar29,1);
              uVar9 = vcmpps_avx512vl(auVar35,auVar30,6);
              uVar10 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar22 + 0xa0),auVar31,1);
              uVar11 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar22 + 0x80),auVar32,6);
              uVar12 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar22 + 0xe0),auVar33,1);
              uVar13 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar22 + 0xc0),auVar34,6);
              uVar23 = (ulong)(byte)(~((byte)uVar11 | (byte)uVar9 | (byte)uVar13 | (byte)uVar8 |
                                      (byte)uVar10 | (byte)uVar12) & (byte)uVar14);
            }
            bVar20 = (byte)uVar23;
            if (bVar20 == 0) {
              if (puVar21 == &local_2378) {
                return bVar16;
              }
              goto LAB_01f30b15;
            }
            auVar35 = *(undefined1 (*) [32])(uVar22 & 0xfffffffffffffff0);
            auVar36 = ((undefined1 (*) [32])(uVar22 & 0xfffffffffffffff0))[1];
            auVar37 = vmovdqa64_avx512vl(auVar49._0_32_);
            auVar37 = vpternlogd_avx512vl(auVar37,auVar41,auVar50._0_32_,0xf8);
            auVar38 = vpcompressd_avx512vl(auVar37);
            auVar39._0_4_ =
                 (uint)(bVar20 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar20 & 1) * auVar37._0_4_;
            bVar17 = (bool)((byte)(uVar23 >> 1) & 1);
            auVar39._4_4_ = (uint)bVar17 * auVar38._4_4_ | (uint)!bVar17 * auVar37._4_4_;
            bVar17 = (bool)((byte)(uVar23 >> 2) & 1);
            auVar39._8_4_ = (uint)bVar17 * auVar38._8_4_ | (uint)!bVar17 * auVar37._8_4_;
            bVar17 = (bool)((byte)(uVar23 >> 3) & 1);
            auVar39._12_4_ = (uint)bVar17 * auVar38._12_4_ | (uint)!bVar17 * auVar37._12_4_;
            bVar17 = (bool)((byte)(uVar23 >> 4) & 1);
            auVar39._16_4_ = (uint)bVar17 * auVar38._16_4_ | (uint)!bVar17 * auVar37._16_4_;
            bVar17 = (bool)((byte)(uVar23 >> 5) & 1);
            auVar39._20_4_ = (uint)bVar17 * auVar38._20_4_ | (uint)!bVar17 * auVar37._20_4_;
            bVar17 = (bool)((byte)(uVar23 >> 6) & 1);
            auVar39._24_4_ = (uint)bVar17 * auVar38._24_4_ | (uint)!bVar17 * auVar37._24_4_;
            bVar17 = SUB81(uVar23 >> 7,0);
            auVar39._28_4_ = (uint)bVar17 * auVar38._28_4_ | (uint)!bVar17 * auVar37._28_4_;
            auVar37 = vpermt2q_avx512vl(auVar35,auVar39,auVar36);
            uVar22 = auVar37._0_8_;
            bVar20 = bVar20 - 1 & bVar20;
          } while (bVar20 == 0);
          auVar37 = vpshufd_avx2(auVar39,0x55);
          vpermt2q_avx512vl(auVar35,auVar37,auVar36);
          auVar38 = vpminsd_avx2(auVar39,auVar37);
          auVar37 = vpmaxsd_avx2(auVar39,auVar37);
          bVar20 = bVar20 - 1 & bVar20;
          if (bVar20 == 0) {
            auVar39 = vpermi2q_avx512vl(auVar38,auVar35,auVar36);
            uVar22 = auVar39._0_8_;
            auVar35 = vpermt2q_avx512vl(auVar35,auVar37,auVar36);
            *puVar21 = auVar35._0_8_;
            auVar35 = vpermd_avx2(auVar37,auVar41);
            *(int *)(puVar21 + 1) = auVar35._0_4_;
            puVar21 = puVar21 + 2;
          }
          else {
            auVar6 = vpshufd_avx2(auVar39,0xaa);
            vpermt2q_avx512vl(auVar35,auVar6,auVar36);
            auVar4 = vpminsd_avx2(auVar38,auVar6);
            auVar38 = vpmaxsd_avx2(auVar38,auVar6);
            auVar6 = vpminsd_avx2(auVar37,auVar38);
            auVar37 = vpmaxsd_avx2(auVar37,auVar38);
            bVar20 = bVar20 - 1 & bVar20;
            if (bVar20 == 0) {
              auVar39 = vpermi2q_avx512vl(auVar4,auVar35,auVar36);
              uVar22 = auVar39._0_8_;
              auVar39 = vpermt2q_avx512vl(auVar35,auVar37,auVar36);
              *puVar21 = auVar39._0_8_;
              auVar37 = vpermd_avx2(auVar37,auVar41);
              *(int *)(puVar21 + 1) = auVar37._0_4_;
              auVar35 = vpermt2q_avx512vl(auVar35,auVar6,auVar36);
              puVar21[2] = auVar35._0_8_;
              auVar35 = vpermd_avx2(auVar6,auVar41);
              *(int *)(puVar21 + 3) = auVar35._0_4_;
              puVar21 = puVar21 + 4;
            }
            else {
              auVar38 = vpshufd_avx2(auVar39,0xff);
              vpermt2q_avx512vl(auVar35,auVar38,auVar36);
              auVar5 = vpminsd_avx2(auVar4,auVar38);
              auVar38 = vpmaxsd_avx2(auVar4,auVar38);
              auVar4 = vpminsd_avx2(auVar6,auVar38);
              auVar38 = vpmaxsd_avx2(auVar6,auVar38);
              auVar6 = vpminsd_avx2(auVar37,auVar38);
              auVar37 = vpmaxsd_avx2(auVar37,auVar38);
              bVar20 = bVar20 - 1 & bVar20;
              if (bVar20 == 0) {
                auVar39 = vpermi2q_avx512vl(auVar5,auVar35,auVar36);
                uVar22 = auVar39._0_8_;
                auVar39 = vpermt2q_avx512vl(auVar35,auVar37,auVar36);
                *puVar21 = auVar39._0_8_;
                auVar37 = vpermd_avx2(auVar37,auVar41);
                *(int *)(puVar21 + 1) = auVar37._0_4_;
                auVar37 = vpermt2q_avx512vl(auVar35,auVar6,auVar36);
                puVar21[2] = auVar37._0_8_;
                auVar37 = vpermd_avx2(auVar6,auVar41);
                *(int *)(puVar21 + 3) = auVar37._0_4_;
                auVar35 = vpermt2q_avx512vl(auVar35,auVar4,auVar36);
                puVar21[4] = auVar35._0_8_;
                auVar35 = vpermd_avx2(auVar4,auVar41);
                *(int *)(puVar21 + 5) = auVar35._0_4_;
                puVar21 = puVar21 + 6;
              }
              else {
                auVar40 = valignd_avx512vl(auVar39,auVar39,3);
                auVar39 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                auVar38 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                               CONCAT48(0x80000000,
                                                                        0x8000000080000000))),
                                            auVar39,auVar5);
                auVar39 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                auVar38 = vpermt2d_avx512vl(auVar38,auVar39,auVar4);
                auVar38 = vpermt2d_avx512vl(auVar38,auVar39,auVar6);
                auVar39 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                auVar37 = vpermt2d_avx512vl(auVar38,auVar39,auVar37);
                auVar42 = ZEXT3264(auVar37);
                bVar19 = bVar20;
                do {
                  auVar39 = auVar42._0_32_;
                  auVar37._8_4_ = 1;
                  auVar37._0_8_ = 0x100000001;
                  auVar37._12_4_ = 1;
                  auVar37._16_4_ = 1;
                  auVar37._20_4_ = 1;
                  auVar37._24_4_ = 1;
                  auVar37._28_4_ = 1;
                  auVar37 = vpermd_avx2(auVar37,auVar40);
                  auVar40 = valignd_avx512vl(auVar40,auVar40,1);
                  vpermt2q_avx512vl(auVar35,auVar40,auVar36);
                  bVar19 = bVar19 - 1 & bVar19;
                  uVar14 = vpcmpd_avx512vl(auVar37,auVar39,5);
                  auVar37 = vpmaxsd_avx2(auVar37,auVar39);
                  bVar15 = (byte)uVar14 << 1;
                  auVar39 = valignd_avx512vl(auVar39,auVar39,7);
                  bVar17 = (bool)((byte)uVar14 & 1);
                  auVar38._4_4_ = (uint)bVar17 * auVar39._4_4_ | (uint)!bVar17 * auVar37._4_4_;
                  auVar38._0_4_ = auVar37._0_4_;
                  bVar17 = (bool)(bVar15 >> 2 & 1);
                  auVar38._8_4_ = (uint)bVar17 * auVar39._8_4_ | (uint)!bVar17 * auVar37._8_4_;
                  bVar17 = (bool)(bVar15 >> 3 & 1);
                  auVar38._12_4_ = (uint)bVar17 * auVar39._12_4_ | (uint)!bVar17 * auVar37._12_4_;
                  bVar17 = (bool)(bVar15 >> 4 & 1);
                  auVar38._16_4_ = (uint)bVar17 * auVar39._16_4_ | (uint)!bVar17 * auVar37._16_4_;
                  bVar17 = (bool)(bVar15 >> 5 & 1);
                  auVar38._20_4_ = (uint)bVar17 * auVar39._20_4_ | (uint)!bVar17 * auVar37._20_4_;
                  bVar17 = (bool)(bVar15 >> 6 & 1);
                  auVar38._24_4_ = (uint)bVar17 * auVar39._24_4_ | (uint)!bVar17 * auVar37._24_4_;
                  auVar38._28_4_ =
                       (uint)(bVar15 >> 7) * auVar39._28_4_ |
                       (uint)!(bool)(bVar15 >> 7) * auVar37._28_4_;
                  auVar42 = ZEXT3264(auVar38);
                } while (bVar19 != 0);
                lVar18 = (ulong)(uint)POPCOUNT((uint)bVar20) + 3;
                do {
                  auVar37 = vpermi2q_avx512vl(auVar38,auVar35,auVar36);
                  *puVar21 = auVar37._0_8_;
                  auVar39 = auVar42._0_32_;
                  auVar37 = vpermd_avx2(auVar39,auVar41);
                  *(int *)(puVar21 + 1) = auVar37._0_4_;
                  auVar38 = valignd_avx512vl(auVar39,auVar39,1);
                  puVar21 = puVar21 + 2;
                  auVar42 = ZEXT3264(auVar38);
                  lVar18 = lVar18 + -1;
                } while (lVar18 != 0);
                auVar35 = vpermt2q_avx512vl(auVar35,auVar38,auVar36);
                uVar22 = auVar35._0_8_;
              }
            }
          }
        } while( true );
      }
LAB_01f310cb:
      auVar25 = vmulps_avx512vl(auVar44._0_32_,auVar44._0_32_);
    } while (puVar21 != &local_2378);
  }
  return bVar16;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }